

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

value * __thiscall cppcms::json::value::get<std::__cxx11::string>(value *this,string *path)

{
  value *in_RDI;
  value *pvVar1;
  
  pvVar1 = in_RDI;
  at(in_RDI,(string *)in_RDI);
  get_value<std::__cxx11::string>(in_RDI);
  return pvVar1;
}

Assistant:

T get(std::string const &path) const
		{
			return at(path).get_value<T>();
		}